

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testDoubleToString(int count)

{
  long lVar1;
  int in_ECX;
  string local_40;
  int local_1c;
  long lStack_18;
  int i;
  long start;
  int count_local;
  
  start._4_4_ = count + -1;
  lStack_18 = GetTickCount();
  for (local_1c = 0; local_1c <= start._4_4_; local_1c = local_1c + 1) {
    FIX::DoubleConvertor::convert_abi_cxx11_(&local_40,(DoubleConvertor *)0x0,123.45,0xf,in_ECX);
    std::__cxx11::string::~string((string *)&local_40);
  }
  lVar1 = GetTickCount();
  return lVar1 - lStack_18;
}

Assistant:

long testDoubleToString(int count) {
  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    FIX::DoubleConvertor::convert(123.45);
  }
  return GetTickCount() - start;
}